

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_Verify(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pData,CK_ULONG ulDataLen,
                 CK_BYTE_PTR pSignature,CK_ULONG ulSignatureLen)

{
  int iVar1;
  Session *this_00;
  MacAlgorithm *pMVar2;
  long in_RDX;
  long in_RDI;
  long in_R8;
  CK_SESSION_HANDLE unaff_retaddr;
  Session *session;
  CK_BYTE_PTR in_stack_00000040;
  CK_ULONG in_stack_00000048;
  CK_BYTE_PTR in_stack_00000050;
  Session *in_stack_00000058;
  CK_ULONG in_stack_00000078;
  CK_BYTE_PTR in_stack_00000080;
  CK_ULONG in_stack_00000088;
  CK_BYTE_PTR in_stack_00000090;
  Session *in_stack_00000098;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == 0) {
    local_8 = 7;
  }
  else if (in_R8 == 0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)HandleManager::getSession((HandleManager *)session,unaff_retaddr);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar1 = Session::getOpType(this_00);
      if (iVar1 == 6) {
        pMVar2 = Session::getMacOp(this_00);
        if (pMVar2 == (MacAlgorithm *)0x0) {
          local_8 = AsymVerify(in_stack_00000098,in_stack_00000090,in_stack_00000088,
                               in_stack_00000080,in_stack_00000078);
        }
        else {
          local_8 = MacVerify(in_stack_00000058,in_stack_00000050,in_stack_00000048,
                              in_stack_00000040,(CK_ULONG)this);
        }
      }
      else {
        local_8 = 0x91;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_Verify(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pData, CK_ULONG ulDataLen, CK_BYTE_PTR pSignature, CK_ULONG ulSignatureLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pData == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pSignature == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_VERIFY)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacVerify(session, pData, ulDataLen,
				 pSignature, ulSignatureLen);
	else
		return AsymVerify(session, pData, ulDataLen,
				  pSignature, ulSignatureLen);
}